

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall
ThreadPool<std::packaged_task<void_()>_>::~ThreadPool
          (ThreadPool<std::packaged_task<void_()>_> *this)

{
  bool bVar1;
  iterator this_00;
  NotLockFreeQueue<std::packaged_task<void_()>_> *in_RDI;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> local_18
  ;
  size_t *local_10;
  
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffcf);
  local_10 = &in_RDI[1].queue.c.
              super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
  local_18._M_current =
       (thread *)
       std::vector<std::thread,_std::allocator<std::thread>_>::begin
                 ((vector<std::thread,_std::allocator<std::thread>_> *)
                  CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::end
                      ((vector<std::thread,_std::allocator<std::thread>_> *)
                       CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&local_18);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&local_18);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)this_00._M_current);
  NotLockFreeQueue<std::packaged_task<void_()>_>::~NotLockFreeQueue(in_RDI);
  return;
}

Assistant:

ThreadPool<T>::~ThreadPool() {
    is_working = false;
    for (auto& thread : threads) {
        thread.join();
    }
}